

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O1

void __thiscall
ConfidentialTxInReference_Constractor_Test::TestBody
          (ConfidentialTxInReference_Constractor_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  uint32_t uVar3;
  AssertHelperData *pAVar4;
  AssertHelperData *pAVar5;
  ulong uVar6;
  size_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  char *pcVar9;
  long lVar10;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  AssertionResult gtest_ar_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0 [2];
  undefined1 local_3a8 [32];
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_14;
  ScriptWitness exp_witness_stack;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_328;
  ScriptWitness exp_pegin_witness;
  ConfidentialTxInReference txinref;
  ConfidentialTxIn txin;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            (&txin,&exp_txid,2,0xfffffffe,&exp_script,&exp_witness_stack,&exp_blinding_nonce,
             &exp_asset_entropy,&exp_issuance_amount,&exp_inflation_keys,
             &exp_issuance_amount_rangeproof,&exp_inflation_keys_rangeproof,&exp_pegin_witness);
  cfd::core::ConfidentialTxIn::GetWitnessHash((ByteData256 *)&gtest_ar_1,&txin);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&txinref,(ByteData256 *)&gtest_ar_1);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txin.GetWitnessHash().GetHex().c_str()",
             "\"c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c\"",
             (char *)txinref.super_AbstractTxInReference._vptr_AbstractTxInReference,
             "c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c");
  if ((ByteData *)txinref.super_AbstractTxInReference._vptr_AbstractTxInReference !=
      &txinref.super_AbstractTxInReference.txid_.data_) {
    operator_delete(txinref.super_AbstractTxInReference._vptr_AbstractTxInReference,
                    (ulong)(txinref.super_AbstractTxInReference.txid_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (gtest_ar_1._0_8_ != 0) {
    operator_delete((void *)gtest_ar_1._0_8_,local_3d0[0]._M_allocated_capacity - gtest_ar_1._0_8_);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&txinref);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x158,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&txinref);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (txinref.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (txinref.super_AbstractTxInReference._vptr_AbstractTxInReference != (_func_int **)0x0)) {
        (**(code **)(*txinref.super_AbstractTxInReference._vptr_AbstractTxInReference + 8))();
      }
      txinref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxInReference::ConfidentialTxInReference(&txinref,&txin);
  gtest_ar._0_4_ = txinref.super_AbstractTxInReference.vout_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_1,"txinref.GetVout()","exp_index",(uint *)&gtest_ar,&exp_index);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x15b,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_1.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar._0_4_ = txinref.super_AbstractTxInReference.sequence_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_1,"txinref.GetSequence()","exp_sequence",(uint *)&gtest_ar,
             &exp_sequence);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x15c,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_1.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,&txinref.super_AbstractTxInReference.txid_);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar_1,(Txid *)&gtest_ar);
  uVar1 = gtest_ar_1._0_8_;
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_3a8,&exp_txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"txinref.GetTxid().GetHex().c_str()",
             "exp_txid.GetHex().c_str()",(char *)uVar1,(char *)local_3a8._0_8_);
  pAVar5 = (AssertHelperData *)(local_3a8 + 0x10);
  if ((AssertHelperData *)local_3a8._0_8_ != pAVar5) {
    operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar_1._0_8_ != local_3d0) {
    operator_delete((void *)gtest_ar_1._0_8_,local_3d0[0]._M_allocated_capacity + 1);
  }
  gtest_ar._0_8_ = &PTR__Txid_007e3348;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_,local_3f0._8_8_ - (long)gtest_ar.message_.ptr_);
  }
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x15d,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (gtest_ar_1._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_1._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
      }
      gtest_ar_1.success_ = false;
      gtest_ar_1._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_3.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script
            ((Script *)&gtest_ar_1,&txinref.super_AbstractTxInReference.unlocking_script_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar,(Script *)&gtest_ar_1);
  uVar1 = gtest_ar._0_8_;
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_3a8,&exp_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"txinref.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",(char *)uVar1,(char *)local_3a8._0_8_);
  if ((AssertHelperData *)local_3a8._0_8_ != pAVar5) {
    operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_3f0) {
    operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3f0._M_allocated_capacity + 1));
  }
  cfd::core::Script::~Script((Script *)&gtest_ar_1);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x15f,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (gtest_ar_1._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_1._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
      }
      gtest_ar_1.success_ = false;
      gtest_ar_1._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_3.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._0_8_ = (AssertHelperData *)0x0;
  local_3a8._8_8_ = (pointer)0x0;
  local_3a8._16_8_ = 0;
  uVar6 = (long)txinref.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txinref.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar6);
  }
  local_3a8._16_8_ = uVar6 + (long)pAVar4;
  sVar7 = (long)txinref.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txinref.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_3a8._0_8_ = pAVar4;
  if (sVar7 != 0) {
    local_3a8._8_8_ = pAVar4;
    memmove(pAVar4,txinref.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar7);
  }
  local_3a8._8_8_ = (long)pAVar4 + sVar7;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData256 *)local_3a8);
  uVar1 = gtest_ar_1._0_8_;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_blinding_nonce);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"txinref.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_3f0) {
    operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3f0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar_1._0_8_ != local_3d0) {
    operator_delete((void *)gtest_ar_1._0_8_,local_3d0[0]._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ - local_3a8._0_8_);
  }
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x161,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (gtest_ar_1._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_1._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
      }
      gtest_ar_1.success_ = false;
      gtest_ar_1._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_3.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._0_8_ = (AssertHelperData *)0x0;
  local_3a8._8_8_ = (pointer)0x0;
  local_3a8._16_8_ = 0;
  uVar6 = (long)txinref.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txinref.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar6);
  }
  local_3a8._16_8_ = uVar6 + (long)pAVar4;
  sVar7 = (long)txinref.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txinref.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_3a8._0_8_ = pAVar4;
  if (sVar7 != 0) {
    local_3a8._8_8_ = pAVar4;
    memmove(pAVar4,txinref.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar7);
  }
  local_3a8._8_8_ = (long)pAVar4 + sVar7;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData256 *)local_3a8);
  uVar1 = gtest_ar_1._0_8_;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_asset_entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"txinref.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_3f0) {
    operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3f0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar_1._0_8_ != local_3d0) {
    operator_delete((void *)gtest_ar_1._0_8_,local_3d0[0]._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ - local_3a8._0_8_);
  }
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x163,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (gtest_ar_1._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_1._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
      }
      gtest_ar_1.success_ = false;
      gtest_ar_1._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_3.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar_1,&txinref.issuance_amount_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)&gtest_ar,(ConfidentialValue *)&gtest_ar_1);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_3a8,&exp_issuance_amount);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"txinref.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",(char *)uVar1,(char *)local_3a8._0_8_);
  if ((AssertHelperData *)local_3a8._0_8_ != pAVar5) {
    operator_delete((void *)local_3a8._0_8_,(ulong)(local_3a8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_3f0) {
    operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3f0._M_allocated_capacity + 1));
  }
  gtest_ar_1._0_8_ = &PTR__ConfidentialValue_007f6a50;
  if (gtest_ar_1.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar_1.message_.ptr_,local_3d0[0]._8_8_ - (long)gtest_ar_1.message_.ptr_);
  }
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x165,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (gtest_ar_1._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_1._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
      }
      gtest_ar_1.success_ = false;
      gtest_ar_1._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_3.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar_1,&txinref.inflation_keys_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)&gtest_ar,(ConfidentialValue *)&gtest_ar_1);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_3a8,&exp_inflation_keys);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"txinref.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",(char *)uVar1,(char *)local_3a8._0_8_);
  if ((AssertHelperData *)local_3a8._0_8_ != pAVar5) {
    operator_delete((void *)local_3a8._0_8_,(ulong)(local_3a8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_3f0) {
    operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3f0._M_allocated_capacity + 1));
  }
  gtest_ar_1._0_8_ = &PTR__ConfidentialValue_007f6a50;
  if (gtest_ar_1.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar_1.message_.ptr_,local_3d0[0]._8_8_ - (long)gtest_ar_1.message_.ptr_);
  }
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x167,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (gtest_ar_1._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_1._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
      }
      gtest_ar_1.success_ = false;
      gtest_ar_1._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_3.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._0_8_ = (AssertHelperData *)0x0;
  local_3a8._8_8_ = (pointer)0x0;
  local_3a8._16_8_ = 0;
  uVar6 = (long)txinref.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txinref.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar5 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar5 = (AssertHelperData *)operator_new(uVar6);
  }
  local_3a8._16_8_ = uVar6 + (long)pAVar5;
  sVar7 = (long)txinref.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txinref.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_3a8._0_8_ = pAVar5;
  if (sVar7 != 0) {
    local_3a8._8_8_ = pAVar5;
    memmove(pAVar5,txinref.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar7);
  }
  local_3a8._8_8_ = (long)pAVar5 + sVar7;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)local_3a8);
  uVar1 = gtest_ar_1._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_issuance_amount_rangeproof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"txinref.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_3f0) {
    operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3f0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar_1._0_8_ != local_3d0) {
    operator_delete((void *)gtest_ar_1._0_8_,local_3d0[0]._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ - local_3a8._0_8_);
  }
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x169,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (gtest_ar_1._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_1._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
      }
      gtest_ar_1.success_ = false;
      gtest_ar_1._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_3.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8._0_8_ = (AssertHelperData *)0x0;
  local_3a8._8_8_ = (pointer)0x0;
  local_3a8._16_8_ = 0;
  uVar6 = (long)txinref.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txinref.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar5 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar5 = (AssertHelperData *)operator_new(uVar6);
  }
  local_3a8._16_8_ = uVar6 + (long)pAVar5;
  sVar7 = (long)txinref.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txinref.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_3a8._0_8_ = pAVar5;
  if (sVar7 != 0) {
    local_3a8._8_8_ = pAVar5;
    memmove(pAVar5,txinref.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar7);
  }
  local_3a8._8_8_ = (long)pAVar5 + sVar7;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_1,(ByteData *)local_3a8);
  uVar1 = gtest_ar_1._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_inflation_keys_rangeproof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"txinref.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != &local_3f0) {
    operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3f0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar_1._0_8_ != local_3d0) {
    operator_delete((void *)gtest_ar_1._0_8_,local_3d0[0]._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_3a8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ - local_3a8._0_8_);
  }
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x16b,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (gtest_ar_1._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_1._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
      }
      gtest_ar_1.success_ = false;
      gtest_ar_1._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_3.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = cfd::core::ScriptWitness::GetWitnessNum
                    (&txinref.super_AbstractTxInReference.script_witness_);
  gtest_ar._0_4_ = uVar3;
  uVar3 = cfd::core::ScriptWitness::GetWitnessNum(&exp_witness_stack);
  local_3a8._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_1,"txinref.GetScriptWitnessStackNum()",
             "exp_witness_stack.GetWitnessNum()",(uint *)&gtest_ar,(uint *)local_3a8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x16d,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a8);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_1.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_1._0_8_ = &PTR__ScriptWitness_007e9920;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_1.message_,
             &txinref.super_AbstractTxInReference.script_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_3a8,
             (ScriptWitness *)&gtest_ar_1);
  gtest_ar_1._0_8_ = &PTR__ScriptWitness_007e9920;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_1.message_);
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_3,
             &exp_witness_stack);
  if (local_3a8._8_8_ != local_3a8._0_8_) {
    lVar10 = 0;
    uVar6 = 0;
    do {
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&gtest_ar_1,(ByteData *)(local_3a8._0_8_ + lVar10));
      uVar1 = gtest_ar_1._0_8_;
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&gtest_ar,
                 (ByteData *)(CONCAT71(gtest_ar_3._1_7_,gtest_ar_3.success_) + lVar10));
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar_12,"test_vector[idx].GetHex().c_str()",
                 "exp_vector[idx].GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != &local_3f0) {
        operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3f0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar_1._0_8_ != local_3d0) {
        operator_delete((void *)gtest_ar_1._0_8_,local_3d0[0]._M_allocated_capacity + 1);
      }
      if (gtest_ar_12.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_1);
        pcVar9 = "";
        if (gtest_ar_12.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((gtest_ar_12.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x173,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
        if (gtest_ar_1._0_8_ != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (gtest_ar_1._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
          }
          gtest_ar_1.success_ = false;
          gtest_ar_1._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_12.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar6 = uVar6 + 1;
      lVar10 = lVar10 + 0x18;
    } while (uVar6 < (ulong)(((long)(local_3a8._8_8_ - local_3a8._0_8_) >> 3) * -0x5555555555555555)
            );
  }
  uVar3 = cfd::core::ScriptWitness::GetWitnessNum(&txinref.pegin_witness_);
  gtest_ar._0_4_ = uVar3;
  gtest_ar_12._0_4_ = cfd::core::ScriptWitness::GetWitnessNum(&exp_pegin_witness);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_1,"txinref.GetPeginWitnessStackNum()",
             "exp_pegin_witness.GetWitnessNum()",(uint *)&gtest_ar,(uint *)&gtest_ar_12);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x176,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_1.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_1._0_8_ = &PTR__ScriptWitness_007e9920;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_1.message_,&txinref.pegin_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_12,
             (ScriptWitness *)&gtest_ar_1);
  gtest_ar_1._0_8_ = &PTR__ScriptWitness_007e9920;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_1.message_);
  cfd::core::ScriptWitness::GetWitness(&local_328,&exp_pegin_witness);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(gtest_ar_12._4_4_,gtest_ar_12._0_4_);
  if (gtest_ar_12.message_.ptr_ != pbVar8) {
    lVar10 = 0;
    uVar6 = 0;
    do {
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&gtest_ar_1,(ByteData *)((long)&(pbVar8->_M_dataplus)._M_p + lVar10));
      uVar1 = gtest_ar_1._0_8_;
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&gtest_ar,
                 (ByteData *)
                 ((long)&((local_328.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar10));
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar_14,"test_peg_vector[idx].GetHex().c_str()",
                 "exp_peg_vector[idx].GetHex().c_str()",(char *)uVar1,(char *)gtest_ar._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != &local_3f0) {
        operator_delete((void *)gtest_ar._0_8_,(ulong)(local_3f0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar_1._0_8_ != local_3d0) {
        operator_delete((void *)gtest_ar_1._0_8_,local_3d0[0]._M_allocated_capacity + 1);
      }
      if (gtest_ar_14.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_1);
        pcVar9 = "";
        if (gtest_ar_14.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((gtest_ar_14.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x17c,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
        if (gtest_ar_1._0_8_ != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (gtest_ar_1._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
          }
          gtest_ar_1.success_ = false;
          gtest_ar_1._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_14.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar6 = uVar6 + 1;
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(gtest_ar_12._4_4_,gtest_ar_12._0_4_);
      lVar10 = lVar10 + 0x18;
    } while (uVar6 < (ulong)(((long)gtest_ar_12.message_.ptr_ - (long)pbVar8 >> 3) *
                            -0x5555555555555555));
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_328);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_12);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_3);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_3a8);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&txinref);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin);
  exp_pegin_witness._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_007e9920;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&exp_pegin_witness.witness_stack_);
  exp_witness_stack._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_007e9920;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&exp_witness_stack.witness_stack_);
  return;
}

Assistant:

TEST(ConfidentialTxInReference, Constractor) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();

  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(),
    "c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c");
  
  ConfidentialTxInReference txinref(txin);
  EXPECT_EQ(txinref.GetVout(), exp_index);
  EXPECT_EQ(txinref.GetSequence(), exp_sequence);
  EXPECT_STREQ(txinref.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txinref.GetUnlockingScript().GetHex().c_str(),
      exp_script.GetHex().c_str());
  EXPECT_STREQ(txinref.GetBlindingNonce().GetHex().c_str(),
      exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txinref.GetAssetEntropy().GetHex().c_str(),
      exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txinref.GetIssuanceAmount().GetHex().c_str(),
      exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txinref.GetInflationKeys().GetHex().c_str(),
      exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txinref.GetIssuanceAmountRangeproof().GetHex().c_str(),
      exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txinref.GetInflationKeysRangeproof().GetHex().c_str(),
      exp_inflation_keys_rangeproof.GetHex().c_str());
  EXPECT_EQ(txinref.GetScriptWitnessStackNum(),
      exp_witness_stack.GetWitnessNum());
  const std::vector<ByteData>& test_vector = txinref.GetScriptWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_vector = exp_witness_stack.GetWitness();
  for (size_t idx = 0; idx < test_vector.size(); ++idx) {
    EXPECT_STREQ(test_vector[idx].GetHex().c_str(),
        exp_vector[idx].GetHex().c_str());
  }
  EXPECT_EQ(txinref.GetPeginWitnessStackNum(),
      exp_pegin_witness.GetWitnessNum());
  const std::vector<ByteData>& test_peg_vector = txinref.GetPeginWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_peg_vector = exp_pegin_witness.GetWitness();
  for (size_t idx = 0; idx < test_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
        exp_peg_vector[idx].GetHex().c_str());
  }
}